

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_batch_insert.cpp
# Opt level: O2

SinkFinalizeType __thiscall
duckdb::PhysicalBatchInsert::Finalize
          (PhysicalBatchInsert *this,Pipeline *pipeline,Event *event,ClientContext *context,
          OperatorSinkFinalizeInput *input)

{
  BatchMemoryManager *this_00;
  GlobalSinkState *pGVar1;
  TableCatalogEntry *table;
  __pthread_internal_list *p_Var2;
  PhysicalIndex collection_index;
  pointer pPVar3;
  RowGroup *pRVar4;
  int iVar5;
  undefined4 extraout_var;
  DuckTransaction *transaction;
  RowGroupCollection *pRVar6;
  pointer pCVar7;
  type pOVar8;
  OptimisticDataWriter *this_01;
  InternalException *this_02;
  RowGroupBatchEntry *entry;
  __pthread_internal_list *p_Var9;
  unique_ptr<duckdb::CollectionMerger,_std::default_delete<duckdb::CollectionMerger>,_true> *merger;
  TableAppendState *this_03;
  pointer pPVar10;
  unique_ptr<duckdb::CollectionMerger,_std::default_delete<duckdb::CollectionMerger>,_true>
  current_merger;
  vector<duckdb::PhysicalIndex,_true> final_collections;
  templated_unique_single_t writer;
  PhysicalIndex local_150;
  LocalAppendState append_state;
  DataTable *args;
  
  pGVar1 = input->global_state;
  table = (TableCatalogEntry *)
          pGVar1[4].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.__align;
  iVar5 = (*(table->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry._vptr_CatalogEntry
            [0x10])(table);
  args = (DataTable *)CONCAT44(extraout_var,iVar5);
  this_00 = (BatchMemoryManager *)(pGVar1 + 1);
  if ((((ulong)pGVar1[4].super_StateWithBlockableTasks.blocked_tasks.
               super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
               super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage & 1) == 0) &&
     (*(ulong *)((long)&pGVar1[4].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex +
                0x10) <
      *(ulong *)((long)&pGVar1[4].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex + 8
                ))) {
    LocalAppendState::LocalAppendState(&append_state);
    DataTable::InitializeLocalAppend(args,&append_state,table,context,&this->bound_constraints);
    transaction = DuckTransaction::Get
                            (context,(table->super_StandardEntry).super_InCatalogEntry.catalog);
    p_Var2 = pGVar1[4].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.__data.__list.
             __next;
    for (p_Var9 = pGVar1[4].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.__data.
                  __list.__prev; p_Var9 != p_Var2;
        p_Var9 = (__pthread_internal_list *)&p_Var9[2].__next) {
      if (*(char *)&p_Var9[2].__prev != '\x01') {
        this_02 = (InternalException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&final_collections,"Encountered a flushed batch",
                   (allocator *)&current_merger);
        InternalException::InternalException(this_02,(string *)&final_collections);
        __cxa_throw(this_02,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      BatchMemoryManager::ReduceUnflushedMemory(this_00,(idx_t)p_Var9[1].__prev);
      pRVar6 = DataTable::GetOptimisticCollection(args,context,(PhysicalIndex)p_Var9[1].__next);
      final_collections.super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
      super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      final_collections.super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
      super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      final_collections.super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
      super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      final_collections.super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
      super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)operator_new(0x18);
      (final_collections.super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>
       .super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>._M_impl.
       super__Vector_impl_data._M_start)->index = (idx_t)args;
      final_collections.super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
      super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>._M_impl.
      super__Vector_impl_data._M_start[1].index = (idx_t)&append_state;
      final_collections.super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
      super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>._M_impl.
      super__Vector_impl_data._M_start[2].index = (idx_t)context;
      final_collections.super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
      super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)::std::
                    _Function_handler<bool_(duckdb::DataChunk_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/execution/operator/persistent/physical_batch_insert.cpp:669:32)>
                    ::_M_manager;
      RowGroupCollection::Scan
                (pRVar6,transaction,(function<bool_(duckdb::DataChunk_&)> *)&final_collections);
      ::std::_Function_base::~_Function_base((_Function_base *)&final_collections);
      DataTable::ResetOptimisticCollection(args,context,(PhysicalIndex)p_Var9[1].__next);
    }
    p_Var9 = pGVar1[4].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.__data.__list.
             __prev;
    if (pGVar1[4].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.__data.__list.
        __next != p_Var9) {
      pGVar1[4].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.__data.__list.__next
           = p_Var9;
    }
    DataTable::FinalizeLocalAppend(args,&append_state);
    BatchMemoryManager::FinalCheck(this_00);
    LocalAppendState::~LocalAppendState(&append_state);
  }
  else {
    append_state.append_state.row_group_append_state.states.
    super_unique_ptr<duckdb::ColumnAppendState[],_std::default_delete<duckdb::ColumnAppendState[]>_>
    ._M_t.
    super___uniq_ptr_impl<duckdb::ColumnAppendState,_std::default_delete<duckdb::ColumnAppendState[]>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::ColumnAppendState_*,_std::default_delete<duckdb::ColumnAppendState[]>_>
    .super__Head_base<0UL,_duckdb::ColumnAppendState_*,_false>._M_head_impl =
         (unique_ptr<duckdb::ColumnAppendState[],_std::default_delete<duckdb::ColumnAppendState[]>_>
         )(__uniq_ptr_data<duckdb::ColumnAppendState,_std::default_delete<duckdb::ColumnAppendState[]>,_true,_true>
           )0x0;
    current_merger.
    super_unique_ptr<duckdb::CollectionMerger,_std::default_delete<duckdb::CollectionMerger>_>._M_t.
    super___uniq_ptr_impl<duckdb::CollectionMerger,_std::default_delete<duckdb::CollectionMerger>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::CollectionMerger_*,_std::default_delete<duckdb::CollectionMerger>_>
    .super__Head_base<0UL,_duckdb::CollectionMerger_*,_false>._M_head_impl =
         (unique_ptr<duckdb::CollectionMerger,_std::default_delete<duckdb::CollectionMerger>_>)
         (__uniq_ptr_data<duckdb::CollectionMerger,_std::default_delete<duckdb::CollectionMerger>,_true,_true>
          )0x0;
    append_state.append_state.row_group_append_state.parent = (TableAppendState *)0x0;
    append_state.append_state.row_group_append_state.row_group = (RowGroup *)0x0;
    p_Var2 = pGVar1[4].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.__data.__list.
             __next;
    for (p_Var9 = pGVar1[4].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.__data.
                  __list.__prev; p_Var9 != p_Var2;
        p_Var9 = (__pthread_internal_list *)&p_Var9[2].__next) {
      if (*(char *)&p_Var9[2].__prev == '\x01') {
        if (current_merger.
            super_unique_ptr<duckdb::CollectionMerger,_std::default_delete<duckdb::CollectionMerger>_>
            ._M_t.
            super___uniq_ptr_impl<duckdb::CollectionMerger,_std::default_delete<duckdb::CollectionMerger>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::CollectionMerger_*,_std::default_delete<duckdb::CollectionMerger>_>
            .super__Head_base<0UL,_duckdb::CollectionMerger_*,_false>._M_head_impl ==
            (__uniq_ptr_data<duckdb::CollectionMerger,_std::default_delete<duckdb::CollectionMerger>,_true,_true>
             )0x0) {
          make_uniq<duckdb::CollectionMerger,duckdb::ClientContext&,duckdb::DataTable&>
                    ((duckdb *)&final_collections,context,args);
          pPVar3 = final_collections.
                   super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
                   super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          final_collections.
          super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
          super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          ::std::
          __uniq_ptr_impl<duckdb::CollectionMerger,_std::default_delete<duckdb::CollectionMerger>_>
          ::reset((__uniq_ptr_impl<duckdb::CollectionMerger,_std::default_delete<duckdb::CollectionMerger>_>
                   *)&current_merger,(pointer)pPVar3);
          ::std::
          unique_ptr<duckdb::CollectionMerger,_std::default_delete<duckdb::CollectionMerger>_>::
          ~unique_ptr((unique_ptr<duckdb::CollectionMerger,_std::default_delete<duckdb::CollectionMerger>_>
                       *)&final_collections);
        }
        pCVar7 = unique_ptr<duckdb::CollectionMerger,_std::default_delete<duckdb::CollectionMerger>,_true>
                 ::operator->(&current_merger);
        CollectionMerger::AddCollection
                  (pCVar7,(PhysicalIndex)p_Var9[1].__next,*(RowGroupBatchType *)&p_Var9[2].__prev);
        BatchMemoryManager::ReduceUnflushedMemory(this_00,(idx_t)p_Var9[1].__prev);
      }
      else {
        if (current_merger.
            super_unique_ptr<duckdb::CollectionMerger,_std::default_delete<duckdb::CollectionMerger>_>
            ._M_t.
            super___uniq_ptr_impl<duckdb::CollectionMerger,_std::default_delete<duckdb::CollectionMerger>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::CollectionMerger_*,_std::default_delete<duckdb::CollectionMerger>_>
            .super__Head_base<0UL,_duckdb::CollectionMerger_*,_false>._M_head_impl !=
            (__uniq_ptr_data<duckdb::CollectionMerger,_std::default_delete<duckdb::CollectionMerger>,_true,_true>
             )0x0) {
          ::std::
          vector<duckdb::unique_ptr<duckdb::CollectionMerger,std::default_delete<duckdb::CollectionMerger>,true>,std::allocator<duckdb::unique_ptr<duckdb::CollectionMerger,std::default_delete<duckdb::CollectionMerger>,true>>>
          ::
          emplace_back<duckdb::unique_ptr<duckdb::CollectionMerger,std::default_delete<duckdb::CollectionMerger>,true>>
                    ((vector<duckdb::unique_ptr<duckdb::CollectionMerger,std::default_delete<duckdb::CollectionMerger>,true>,std::allocator<duckdb::unique_ptr<duckdb::CollectionMerger,std::default_delete<duckdb::CollectionMerger>,true>>>
                      *)&append_state,&current_merger);
          ::std::
          __uniq_ptr_impl<duckdb::CollectionMerger,_std::default_delete<duckdb::CollectionMerger>_>
          ::reset((__uniq_ptr_impl<duckdb::CollectionMerger,_std::default_delete<duckdb::CollectionMerger>_>
                   *)&current_merger,(pointer)0x0);
        }
        make_uniq<duckdb::CollectionMerger,duckdb::ClientContext&,duckdb::DataTable&>
                  ((duckdb *)&final_collections,context,args);
        pCVar7 = unique_ptr<duckdb::CollectionMerger,_std::default_delete<duckdb::CollectionMerger>,_true>
                 ::operator->((unique_ptr<duckdb::CollectionMerger,_std::default_delete<duckdb::CollectionMerger>,_true>
                               *)&final_collections);
        CollectionMerger::AddCollection
                  (pCVar7,(PhysicalIndex)p_Var9[1].__next,*(RowGroupBatchType *)&p_Var9[2].__prev);
        ::std::
        vector<duckdb::unique_ptr<duckdb::CollectionMerger,std::default_delete<duckdb::CollectionMerger>,true>,std::allocator<duckdb::unique_ptr<duckdb::CollectionMerger,std::default_delete<duckdb::CollectionMerger>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::CollectionMerger,std::default_delete<duckdb::CollectionMerger>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::CollectionMerger,std::default_delete<duckdb::CollectionMerger>,true>,std::allocator<duckdb::unique_ptr<duckdb::CollectionMerger,std::default_delete<duckdb::CollectionMerger>,true>>>
                    *)&append_state,
                   (unique_ptr<duckdb::CollectionMerger,_std::default_delete<duckdb::CollectionMerger>,_true>
                    *)&final_collections);
        ::std::unique_ptr<duckdb::CollectionMerger,_std::default_delete<duckdb::CollectionMerger>_>
        ::~unique_ptr((unique_ptr<duckdb::CollectionMerger,_std::default_delete<duckdb::CollectionMerger>_>
                       *)&final_collections);
      }
    }
    p_Var9 = pGVar1[4].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.__data.__list.
             __prev;
    if (pGVar1[4].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.__data.__list.
        __next != p_Var9) {
      pGVar1[4].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.__data.__list.__next
           = p_Var9;
    }
    if (current_merger.
        super_unique_ptr<duckdb::CollectionMerger,_std::default_delete<duckdb::CollectionMerger>_>.
        _M_t.
        super___uniq_ptr_impl<duckdb::CollectionMerger,_std::default_delete<duckdb::CollectionMerger>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::CollectionMerger_*,_std::default_delete<duckdb::CollectionMerger>_>
        .super__Head_base<0UL,_duckdb::CollectionMerger_*,_false>._M_head_impl !=
        (__uniq_ptr_data<duckdb::CollectionMerger,_std::default_delete<duckdb::CollectionMerger>,_true,_true>
         )0x0) {
      ::std::
      vector<duckdb::unique_ptr<duckdb::CollectionMerger,std::default_delete<duckdb::CollectionMerger>,true>,std::allocator<duckdb::unique_ptr<duckdb::CollectionMerger,std::default_delete<duckdb::CollectionMerger>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::CollectionMerger,std::default_delete<duckdb::CollectionMerger>,true>>
                ((vector<duckdb::unique_ptr<duckdb::CollectionMerger,std::default_delete<duckdb::CollectionMerger>,true>,std::allocator<duckdb::unique_ptr<duckdb::CollectionMerger,std::default_delete<duckdb::CollectionMerger>,true>>>
                  *)&append_state,&current_merger);
    }
    final_collections.super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
    super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    final_collections.super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
    super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    final_collections.super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
    super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ::std::vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>::reserve
              (&final_collections.
                super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>,
               (long)append_state.append_state.row_group_append_state.row_group -
               (long)append_state.append_state.row_group_append_state.parent >> 3);
    make_uniq<duckdb::OptimisticDataWriter,duckdb::DataTable&>((duckdb *)&writer,args);
    pRVar4 = append_state.append_state.row_group_append_state.row_group;
    for (this_03 = append_state.append_state.row_group_append_state.parent;
        pPVar3 = final_collections.
                 super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
                 super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
                 _M_impl.super__Vector_impl_data._M_finish,
        pPVar10 = final_collections.
                  super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
                  super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
                  _M_impl.super__Vector_impl_data._M_start, this_03 != (TableAppendState *)pRVar4;
        this_03 = (TableAppendState *)&(this_03->row_group_append_state).row_group) {
      pCVar7 = unique_ptr<duckdb::CollectionMerger,_std::default_delete<duckdb::CollectionMerger>,_true>
               ::operator->((unique_ptr<duckdb::CollectionMerger,_std::default_delete<duckdb::CollectionMerger>,_true>
                             *)this_03);
      pOVar8 = unique_ptr<duckdb::OptimisticDataWriter,_std::default_delete<duckdb::OptimisticDataWriter>,_true>
               ::operator*(&writer);
      local_150 = CollectionMerger::Flush(pCVar7,pOVar8);
      ::std::vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>::
      emplace_back<duckdb::PhysicalIndex>
                (&final_collections.
                  super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>,
                 &local_150);
    }
    for (; pPVar10 != pPVar3; pPVar10 = pPVar10 + 1) {
      collection_index.index = pPVar10->index;
      pRVar6 = DataTable::GetOptimisticCollection(args,context,collection_index);
      DataTable::LocalMerge(args,context,pRVar6);
      DataTable::ResetOptimisticCollection(args,context,collection_index);
    }
    this_01 = DataTable::GetOptimisticWriter(args,context);
    pOVar8 = unique_ptr<duckdb::OptimisticDataWriter,_std::default_delete<duckdb::OptimisticDataWriter>,_true>
             ::operator*(&writer);
    OptimisticDataWriter::Merge(this_01,pOVar8);
    OptimisticDataWriter::FinalFlush(this_01);
    BatchMemoryManager::FinalCheck(this_00);
    ::std::
    unique_ptr<duckdb::OptimisticDataWriter,_std::default_delete<duckdb::OptimisticDataWriter>_>::
    ~unique_ptr(&writer.
                 super_unique_ptr<duckdb::OptimisticDataWriter,_std::default_delete<duckdb::OptimisticDataWriter>_>
               );
    ::std::_Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>::
    ~_Vector_base((_Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_> *)
                  &final_collections);
    ::std::unique_ptr<duckdb::CollectionMerger,_std::default_delete<duckdb::CollectionMerger>_>::
    ~unique_ptr(&current_merger.
                 super_unique_ptr<duckdb::CollectionMerger,_std::default_delete<duckdb::CollectionMerger>_>
               );
    ::std::
    vector<duckdb::unique_ptr<duckdb::CollectionMerger,_std::default_delete<duckdb::CollectionMerger>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CollectionMerger,_std::default_delete<duckdb::CollectionMerger>,_true>_>_>
    ::~vector((vector<duckdb::unique_ptr<duckdb::CollectionMerger,_std::default_delete<duckdb::CollectionMerger>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CollectionMerger,_std::default_delete<duckdb::CollectionMerger>,_true>_>_>
               *)&append_state);
  }
  return READY;
}

Assistant:

SinkFinalizeType PhysicalBatchInsert::Finalize(Pipeline &pipeline, Event &event, ClientContext &context,
                                               OperatorSinkFinalizeInput &input) const {
	auto &g_state = input.global_state.Cast<BatchInsertGlobalState>();
	auto &table = g_state.table;
	auto &data_table = g_state.table.GetStorage();
	auto &memory_manager = g_state.memory_manager;

	if (g_state.optimistically_written || g_state.insert_count >= g_state.row_group_size) {
		// we have written data to disk optimistically or are inserting a large amount of data
		// perform a final pass over all of the row groups and merge them together
		vector<unique_ptr<CollectionMerger>> mergers;
		unique_ptr<CollectionMerger> current_merger;

		for (auto &entry : g_state.collections) {
			if (entry.type == RowGroupBatchType::NOT_FLUSHED) {
				// this collection has not been flushed: add it to the merge set
				if (!current_merger) {
					current_merger = make_uniq<CollectionMerger>(context, data_table);
				}
				current_merger->AddCollection(entry.collection_index, entry.type);
				memory_manager.ReduceUnflushedMemory(entry.unflushed_memory);
				continue;
			}

			// This collection has been flushed, so it does not need to be merged.
			// Create a separate collection merger for it.
			if (current_merger) {
				// Flush any remaining small allocations.
				mergers.push_back(std::move(current_merger));
				current_merger.reset();
			}
			auto larger_merger = make_uniq<CollectionMerger>(context, data_table);
			larger_merger->AddCollection(entry.collection_index, entry.type);
			mergers.push_back(std::move(larger_merger));
		}

		g_state.collections.clear();
		if (current_merger) {
			mergers.push_back(std::move(current_merger));
		}

		// now that we have created all of the mergers, perform the actual merging
		vector<PhysicalIndex> final_collections;
		final_collections.reserve(mergers.size());
		auto writer = make_uniq<OptimisticDataWriter>(data_table);
		for (auto &merger : mergers) {
			final_collections.push_back(merger->Flush(*writer));
		}

		// finally, merge the row groups into the local storage
		for (const auto collection_index : final_collections) {
			auto &collection = data_table.GetOptimisticCollection(context, collection_index);
			data_table.LocalMerge(context, collection);
			data_table.ResetOptimisticCollection(context, collection_index);
		}

		auto &optimistic_writer = data_table.GetOptimisticWriter(context);
		optimistic_writer.Merge(*writer);
		optimistic_writer.FinalFlush();
		memory_manager.FinalCheck();
		return SinkFinalizeType::READY;
	}

	// We are writing a small amount of data to disk.
	// Thus, we append directly to the transaction local storage.
	LocalAppendState append_state;
	data_table.InitializeLocalAppend(append_state, table, context, bound_constraints);
	auto &transaction = DuckTransaction::Get(context, table.catalog);
	for (auto &entry : g_state.collections) {
		if (entry.type != RowGroupBatchType::NOT_FLUSHED) {
			throw InternalException("Encountered a flushed batch");
		}

		memory_manager.ReduceUnflushedMemory(entry.unflushed_memory);
		auto &collection = data_table.GetOptimisticCollection(context, entry.collection_index);
		collection.Scan(transaction, [&](DataChunk &insert_chunk) {
			data_table.LocalAppend(append_state, context, insert_chunk, false);
			return true;
		});
		data_table.ResetOptimisticCollection(context, entry.collection_index);
	}

	g_state.collections.clear();
	data_table.FinalizeLocalAppend(append_state);
	memory_manager.FinalCheck();
	return SinkFinalizeType::READY;
}